

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_42fcc1::cmFunctionFunctionBlocker::Replay
          (cmFunctionFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *status)

{
  bool bVar1;
  cmListFileContext *pcVar2;
  cmState *this_00;
  reference name;
  cmListFileContext local_1b0;
  undefined1 local_140 [32];
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  local_120;
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  local_100;
  undefined1 local_c0 [8];
  cmFunctionHelperCommand f;
  cmMakefile *mf;
  cmExecutionStatus *status_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmFunctionFunctionBlocker *this_local;
  
  f.Line = (long)cmExecutionStatus::GetMakefile(status);
  cmFunctionHelperCommand::cmFunctionHelperCommand((cmFunctionHelperCommand *)local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
             &f.Args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,functions);
  pcVar2 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  std::__cxx11::string::operator=
            ((string *)(f.Policies.Status.super__Base_bitset<8UL>._M_w + 7),
             (string *)&pcVar2->FilePath);
  pcVar2 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  f.FilePath.field_2._8_8_ = pcVar2->Line;
  cmMakefile::RecordPolicies
            ((cmMakefile *)f.Line,
             (PolicyMap *)
             &f.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this_00 = cmMakefile::GetState((cmMakefile *)f.Line);
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front(&this->Args);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmFunctionHelperCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_120,(cmFunctionHelperCommand *)local_c0);
  cmMakefile::GetBacktrace((cmMakefile *)local_140);
  pcVar2 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
  cmListFileContext::cmListFileContext(&local_1b0,pcVar2);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_140 + 0x10),
             (cmListFileContext *)local_140);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::BT(&local_100,&local_120,(cmListFileBacktrace *)(local_140 + 0x10));
  bVar1 = cmState::AddScriptedCommand(this_00,name,&local_100,(cmMakefile *)f.Line);
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  ::~BT(&local_100);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)(local_140 + 0x10));
  cmListFileContext::~cmListFileContext(&local_1b0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_140);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_120);
  cmFunctionHelperCommand::~cmFunctionHelperCommand((cmFunctionHelperCommand *)local_c0);
  return bVar1;
}

Assistant:

bool cmFunctionFunctionBlocker::Replay(
  std::vector<cmListFileFunction> functions, cmExecutionStatus& status)
{
  cmMakefile& mf = status.GetMakefile();
  // create a new command and add it to cmake
  cmFunctionHelperCommand f;
  f.Args = this->Args;
  f.Functions = std::move(functions);
  f.FilePath = this->GetStartingContext().FilePath;
  f.Line = this->GetStartingContext().Line;
  mf.RecordPolicies(f.Policies);
  return mf.GetState()->AddScriptedCommand(
    this->Args.front(),
    BT<cmState::Command>(std::move(f),
                         mf.GetBacktrace().Push(this->GetStartingContext())),
    mf);
}